

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

MutAlgebraicCon __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
          (BasicProblem<mp::BasicProblemParams<int>_> *this,double lb,double ub)

{
  pointer pAVar1;
  pointer pAVar2;
  MutAlgebraicCon MVar3;
  undefined1 local_c0 [12];
  AlgebraicConInfo local_b0;
  
  pAVar1 = (this->algebraic_cons_).
           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->algebraic_cons_).
           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  AlgebraicConInfo::AlgebraicConInfo(&local_b0,lb,ub);
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo,std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo>>
  ::emplace_back<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo>
            ((vector<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo,std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>>::AlgebraicConInfo>>
              *)&this->algebraic_cons_,&local_b0);
  if (6 < local_b0.linear_expr.terms_.
          super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
          super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity) {
    operator_delete(local_b0.linear_expr.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr,
                    local_b0.linear_expr.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity
                    << 4);
  }
  MutAlgebraicCon::MutAlgebraicCon
            ((MutAlgebraicCon *)local_c0,this,
             (int)((ulong)((long)pAVar2 - (long)pAVar1) >> 3) * -0xf0f0f0f);
  MVar3.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  MVar3.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)local_c0._0_8_;
  MVar3.
  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ = local_c0._8_4_;
  return (MutAlgebraicCon)
         MVar3.
         super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>;
}

Assistant:

MutAlgebraicCon AddCon(double lb, double ub) {
    std::size_t num_cons = algebraic_cons_.size();
    MP_ASSERT(num_cons < MP_MAX_PROBLEM_ITEMS,
              "too many algebraic constraints");
    algebraic_cons_.push_back(AlgebraicConInfo(lb, ub));
    return MutAlgebraicCon(this, static_cast<int>(num_cons));
  }